

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O1

int Gia_RsbRemovalCost(Gia_RsbMan_t *p,int Index)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  Vec_Int_t *pVVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  
  iVar1 = p->vObjs->nSize;
  uVar10 = 1 << ((byte)iVar1 & 0x1f);
  uVar2 = p->vSets[0]->nSize;
  if (uVar2 != uVar10) {
    __assert_fail("Vec_WecSize(p->vSets[0]) == (1 << Vec_IntSize(p->vObjs))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x5a1,"int Gia_RsbRemovalCost(Gia_RsbMan_t *, int)");
  }
  uVar3 = p->vSets[1]->nSize;
  if (uVar3 == uVar10) {
    iVar6 = 0;
    if (iVar1 != 0x1f) {
      uVar9 = 1 << ((byte)Index & 0x1f);
      uVar7 = 1;
      if (1 < (int)uVar10) {
        uVar7 = (ulong)uVar10;
      }
      uVar11 = 0;
      lVar8 = 4;
      iVar6 = 0;
      do {
        if ((uVar9 & (uint)uVar11) == 0) {
          if (((((long)(int)uVar2 <= (long)uVar11) || ((long)(int)uVar3 <= (long)uVar11)) ||
              (Index == 0x1f)) ||
             ((uVar10 = uVar9 ^ (uint)uVar11, (int)uVar2 <= (int)uVar10 ||
              ((int)uVar3 <= (int)uVar10)))) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                          ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
          pVVar4 = p->vSets[0]->pArray;
          pVVar5 = p->vSets[1]->pArray;
          iVar6 = iVar6 + (pVVar5[uVar10].nSize + *(int *)((long)&pVVar5->nCap + lVar8)) *
                          (pVVar4[uVar10].nSize + *(int *)((long)&pVVar4->nCap + lVar8));
        }
        uVar11 = uVar11 + 1;
        lVar8 = lVar8 + 0x10;
      } while (uVar7 != uVar11);
    }
    return iVar6;
  }
  __assert_fail("Vec_WecSize(p->vSets[1]) == (1 << Vec_IntSize(p->vObjs))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                ,0x5a2,"int Gia_RsbRemovalCost(Gia_RsbMan_t *, int)");
}

Assistant:

int Gia_RsbRemovalCost( Gia_RsbMan_t * p, int Index )
{
    Vec_Int_t * vTemp[2][2];
    //unsigned Mask = Abc_InfoMask( Index );
    int m, m2, Cost = 0, nLeaves = 1 << Vec_IntSize(p->vObjs);
    assert( Vec_WecSize(p->vSets[0]) == (1 << Vec_IntSize(p->vObjs)) );
    assert( Vec_WecSize(p->vSets[1]) == (1 << Vec_IntSize(p->vObjs)) );
    for ( m = 0; m < nLeaves; m++ )
    {
        if ( m & (1 << Index) )
            continue;
        m2 = m ^ (1 << Index);
        vTemp[0][0] = Vec_WecEntry(p->vSets[0], m);
        vTemp[0][1] = Vec_WecEntry(p->vSets[1], m);
        vTemp[1][0] = Vec_WecEntry(p->vSets[0], m2);
        vTemp[1][1] = Vec_WecEntry(p->vSets[1], m2);
        Cost += (Vec_IntSize(vTemp[0][0]) + Vec_IntSize(vTemp[1][0])) * (Vec_IntSize(vTemp[0][1]) + Vec_IntSize(vTemp[1][1]));
    }
    return Cost;
}